

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O0

int xmlUCSIsCatCo(int code)

{
  undefined1 local_d;
  int code_local;
  
  local_d = true;
  if ((((code != 0xe000) && (local_d = true, code != 0xf8ff)) && (local_d = true, code != 0xf0000))
     && ((local_d = true, code != 0xffffd && (local_d = true, code != 0x100000)))) {
    local_d = code == 0x10fffd;
  }
  return (int)local_d;
}

Assistant:

int
xmlUCSIsCatCo(int code) {
    return((code == 0xe000) ||
           (code == 0xf8ff) ||
           (code == 0xf0000) ||
           (code == 0xffffd) ||
           (code == 0x100000) ||
           (code == 0x10fffd));
}